

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O3

pair<const_pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::linear_node::
lookup<pstore::uint128,pstore::uint128,std::equal_to<pstore::uint128>,void>
          (linear_node *this,database *db,long *key)

{
  span<unsigned_char,__1L> sp;
  index_pointer iVar1;
  unsigned_long uVar2;
  extent_type<_1L> unaff_R12;
  pointer unaff_R13;
  long lVar3;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar4;
  type uninit_buffer;
  uint128 local_58;
  database_reader local_40;
  
  if (this->size_ != 0) {
    lVar3 = this->size_ << 3;
    uVar2 = 0;
    do {
      local_40.addr_.a_ = this->leaves_[uVar2].a_;
      sp.storage_.data_ = unaff_R13;
      sp.storage_.super_extent_type<_1L>.size_ = unaff_R12.size_;
      local_40.db_ = db;
      serialize::flood<_1l>(sp);
      serialize::archive::database_reader::get<pstore::uint128,void>(&local_40,&local_58);
      if ((long)local_58.v_ == *key && local_58.v_._8_8_ == key[1]) {
        iVar1 = (index_pointer)((index_pointer *)(this->leaves_ + uVar2))->internal_;
        goto LAB_0013d4dc;
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + -8;
    } while (lVar3 != 0);
  }
  uVar2 = 0xffffffffffffffff;
  iVar1.internal_ = (internal_node *)0x0;
LAB_0013d4dc:
  pVar4.second = uVar2;
  pVar4.first.internal_ = iVar1.internal_;
  return pVar4;
}

Assistant:

auto linear_node::lookup (database const & db, OtherKeyType const & key,
                                      KeyEqual equal) const
                -> std::pair<index_pointer const, std::size_t> {
                // Linear search. TODO: perhaps we should sort the nodes and use a binary
                // search? This would require a template compare method.
                std::size_t cnum = 0;
                for (auto const & child : *this) {
                    KeyType const existing_key =
                        serialize::read<KeyType> (serialize::archive::database_reader{db, child});
                    if (equal (existing_key, key)) {
                        return {index_pointer{child}, cnum};
                    }
                    ++cnum;
                }
                // Not found
                return {index_pointer (), details::not_found};
            }